

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O2

void Msat_ClauseWriteDimacs(FILE *pFile,Msat_Clause_t *pC,int fIncrement)

{
  ulong uVar1;
  char *pcVar2;
  
  for (uVar1 = 0; uVar1 < (*(uint *)&pC->field_0x4 >> 3 & 0x3fff); uVar1 = uVar1 + 1) {
    pcVar2 = "-";
    if (((&pC[1].Num)[uVar1] & 1U) == 0) {
      pcVar2 = "";
    }
    fprintf((FILE *)pFile,"%s%d ",pcVar2,(ulong)((&pC[1].Num)[uVar1] / 2 + (uint)(0 < fIncrement)));
  }
  if (fIncrement != 0) {
    fputc(0x30,(FILE *)pFile);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Msat_ClauseWriteDimacs( FILE * pFile, Msat_Clause_t * pC, int  fIncrement )
{
    int i;
    for ( i = 0; i < (int)pC->nSize; i++ )
        fprintf( pFile, "%s%d ", ((pC->pData[i]&1)? "-": ""),  pC->pData[i]/2 + (int)(fIncrement>0) );
    if ( fIncrement )
        fprintf( pFile, "0" );
    fprintf( pFile, "\n" );
}